

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_LdLocalElementUndefined<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var pvVar1;
  bool bVar2;
  PropertyId PVar3;
  ScriptContext *scriptContext;
  OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = ParseableFunctionInfo::IsEval(*(ParseableFunctionInfo **)(this + 0x88));
  if (bVar2) {
    pvVar1 = *(Var *)(this + 0x58);
    PVar3 = FunctionBody::GetReferencedPropertyId
                      (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
    scriptContext = GetScriptContext(this);
    Js::JavascriptOperators::OP_LoadUndefinedToElementDynamic(pvVar1,PVar3,scriptContext);
  }
  else {
    pvVar1 = *(Var *)(this + 0x58);
    PVar3 = FunctionBody::GetReferencedPropertyId
                      (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
    Js::JavascriptOperators::OP_LoadUndefinedToElement(pvVar1,PVar3);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdLocalElementUndefined(const unaligned OpLayoutT_ElementRootU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }